

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O1

int testKNNValidatorNoLabels(void)

{
  TypeUnion nnModel;
  bool bVar1;
  ostream *poVar2;
  Arena *arena;
  Model m1;
  Result res;
  Model local_60;
  Result local_30;
  
  CoreML::Specification::Model::Model(&local_60,(Arena *)0x0,false);
  CoreML::KNNValidatorTests::generateInterface(&local_60);
  if (local_60._oneof_case_[0] != 0x194) {
    CoreML::Specification::Model::clear_Type(&local_60);
    local_60._oneof_case_[0] = 0x194;
    arena = (Arena *)(local_60.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_60.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      arena = *(Arena **)arena;
    }
    local_60.Type_.knearestneighborsclassifier_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::KNearestNeighborsClassifier>(arena);
  }
  nnModel = local_60.Type_;
  CoreML::KNNValidatorTests::setNumberOfNeighbors
            (local_60.Type_.knearestneighborsclassifier_,3,true);
  CoreML::KNNValidatorTests::addDataPoints(nnModel.knearestneighborsclassifier_);
  CoreML::validate<(MLModelType)404>(&local_30,&local_60);
  bVar1 = CoreML::Result::good(&local_30);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
               ,0x69);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xbe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30.m_message._M_dataplus._M_p != &local_30.m_message.field_2) {
    operator_delete(local_30.m_message._M_dataplus._M_p,
                    local_30.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_60);
  return (uint)bVar1;
}

Assistant:

int testKNNValidatorNoLabels() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *nnModel = m1.mutable_knearestneighborsclassifier();
    KNNValidatorTests::setNumberOfNeighbors(nnModel, 3, true);

    KNNValidatorTests::addDataPoints(nnModel);

    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    return 0;

}